

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O3

void __thiscall
Painter::Painter(Painter *this,
                vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>
                *nodes)

{
  double dVar1;
  double dVar2;
  Dimensions *pDVar3;
  Document *pDVar4;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  (this->m_objects).
  super__Vector_base<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_objects).
  super__Vector_base<std::shared_ptr<draw_object>,_std::allocator<std::shared_ptr<draw_object>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_nodes = nodes;
  this->m_draw = false;
  this->m_stopThread = false;
  (this->m_draw_thread)._M_id._M_thread = 0;
  pDVar3 = (Dimensions *)operator_new(0x10);
  pDVar3->width = 100.0;
  pDVar3->height = 100.0;
  this->m_dimesnions = pDVar3;
  pDVar4 = (Document *)operator_new(0x70);
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"network.svg","");
  dVar1 = this->m_dimesnions->width;
  dVar2 = this->m_dimesnions->height;
  (pDVar4->file_name)._M_dataplus._M_p = (pointer)&(pDVar4->file_name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)pDVar4,local_48,local_48 + local_40);
  (pDVar4->layout).dimensions.width = dVar1;
  (pDVar4->layout).dimensions.height = dVar2;
  (pDVar4->layout).scale = 1.0;
  (pDVar4->layout).origin = BottomLeft;
  (pDVar4->layout).origin_offset.x = 0.0;
  (pDVar4->layout).origin_offset.y = 0.0;
  (pDVar4->body_nodes_str)._M_dataplus._M_p = (pointer)&(pDVar4->body_nodes_str).field_2;
  (pDVar4->body_nodes_str)._M_string_length = 0;
  (pDVar4->body_nodes_str).field_2._M_local_buf[0] = '\0';
  this->m_doc = pDVar4;
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

Painter::Painter(std::vector<std::shared_ptr<mmWaveBS>>const &nodes)
:m_draw_thread(),
m_nodes(nodes)
{
// 	m_nodes = &nodes;
	m_dimesnions = new svg::Dimensions(100, 100);
	m_doc = new svg::Document("network.svg", svg::Layout(*m_dimesnions, svg::Layout::BottomLeft));
}